

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

lys_module * lys_schema_node_get_module(ly_ctx *ctx,char *prefix_dict,lysp_module *pmod)

{
  lys_module *local_68;
  ulong local_50;
  lysp_import *local_40;
  ulong local_38;
  uint64_t u;
  char *local_prefix;
  lysp_module *pmod_local;
  char *prefix_dict_local;
  ly_ctx *ctx_local;
  
  if (prefix_dict == (char *)0x0) {
    ctx_local = (ly_ctx *)pmod->mod;
  }
  else {
    if (((byte)pmod->field_0x79 >> 1 & 1) == 0) {
      local_40 = (lysp_import *)pmod->mod->prefix;
    }
    else {
      local_40 = pmod[1].imports;
    }
    if (local_40 == (lysp_import *)prefix_dict) {
      ctx_local = (ly_ctx *)pmod->mod;
    }
    else {
      local_38 = 0;
      while( true ) {
        if (pmod->imports == (lysp_import *)0x0) {
          local_50 = 0;
        }
        else {
          local_50 = *(ulong *)(pmod->imports[-1].rev + 6);
        }
        if (local_50 <= local_38) {
          if (((byte)pmod->field_0x79 >> 1 & 1) == 0) {
            local_68 = (lys_module *)pmod->mod->name;
          }
          else {
            local_68 = pmod[1].mod;
          }
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                  "Invalid absolute-schema-nodeid nametest - prefix \"%s\" not defined in module \"%s\"."
                  ,prefix_dict,local_68);
          return (lys_module *)0x0;
        }
        if (pmod->imports[local_38].prefix == prefix_dict) break;
        local_38 = local_38 + 1;
      }
      ctx_local = (ly_ctx *)pmod->imports[local_38].module;
    }
  }
  return (lys_module *)ctx_local;
}

Assistant:

static const struct lys_module *
lys_schema_node_get_module(const struct ly_ctx *ctx, const char *prefix_dict, const struct lysp_module *pmod)
{
    const char *local_prefix;
    LY_ARRAY_COUNT_TYPE u;

    if (!prefix_dict) {
        /* local module */
        return pmod->mod;
    }

    local_prefix = pmod->is_submod ? ((struct lysp_submodule *)pmod)->prefix : pmod->mod->prefix;
    if (local_prefix == prefix_dict) {
        /* local module prefix */
        return pmod->mod;
    }

    LY_ARRAY_FOR(pmod->imports, u) {
        if (pmod->imports[u].prefix == prefix_dict) {
            /* import module prefix */
            return pmod->imports[u].module;
        }
    }

    /* prefix module not found */
    LOGVAL(ctx, LYVE_REFERENCE, "Invalid absolute-schema-nodeid nametest - prefix \"%s\" not defined in module \"%s\".",
            prefix_dict, LYSP_MODULE_NAME(pmod));
    return NULL;
}